

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IImage.h
# Opt level: O2

void __thiscall irr::video::IImage::setMipMapsData(IImage *this,void *data,bool ownForeignMemory)

{
  u32 uVar1;
  u8 *puVar2;
  uint width;
  uint uVar3;
  uint height;
  
  puVar2 = this->MipMapsData;
  if (puVar2 != (u8 *)data) {
    if (this->DeleteMipMapsMemory == true) {
      if (puVar2 != (u8 *)0x0) {
        operator_delete__(puVar2);
      }
      this->DeleteMipMapsMemory = false;
    }
    if (data == (void *)0x0) {
      this->MipMapsData = (u8 *)0x0;
    }
    else if (ownForeignMemory) {
      this->MipMapsData = (u8 *)data;
      this->DeleteMipMapsMemory = false;
    }
    else {
      width = (this->Size).Width;
      height = (this->Size).Height;
      uVar3 = 0;
      do {
        width = width >> (1 < width);
        height = height >> (1 < height);
        uVar1 = getDataSizeFromFormat(this->Format,width,height);
        uVar3 = uVar3 + uVar1;
      } while (height != 1 || width != 1);
      puVar2 = (u8 *)operator_new__((ulong)uVar3);
      this->MipMapsData = puVar2;
      memcpy(puVar2,data,(ulong)uVar3);
      this->DeleteMipMapsMemory = true;
    }
  }
  return;
}

Assistant:

void setMipMapsData(void *data, bool ownForeignMemory)
	{
		if (data != MipMapsData) {
			if (DeleteMipMapsMemory) {
				delete[] MipMapsData;

				DeleteMipMapsMemory = false;
			}

			if (data) {
				if (ownForeignMemory) {
					MipMapsData = static_cast<u8 *>(data);

					DeleteMipMapsMemory = false;
				} else {
					u32 dataSize = 0;
					u32 width = Size.Width;
					u32 height = Size.Height;

					do {
						if (width > 1)
							width >>= 1;

						if (height > 1)
							height >>= 1;

						dataSize += getDataSizeFromFormat(Format, width, height);
					} while (width != 1 || height != 1);

					MipMapsData = new u8[dataSize];
					memcpy(MipMapsData, data, dataSize);

					DeleteMipMapsMemory = true;
				}
			} else {
				MipMapsData = 0;
			}
		}
	}